

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O2

ConfusableMatcher * LidlNormalizerCMSetup(void)

{
  ConfusableMatcher *this;
  long lVar1;
  ulong uVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_1c2e;
  allocator<char> local_1c2d;
  allocator<char> local_1c2c;
  allocator<char> local_1c2b;
  allocator<char> local_1c2a;
  allocator<char> local_1c29;
  allocator<char> local_1c28;
  allocator<char> local_1c27;
  allocator<char> local_1c26;
  allocator<char> local_1c25;
  allocator<char> local_1c24;
  allocator<char> local_1c23;
  allocator<char> local_1c22;
  allocator<char> local_1c21;
  allocator<char> local_1c20;
  allocator<char> local_1c1f;
  allocator<char> local_1c1e;
  allocator<char> local_1c1d;
  allocator<char> local_1c1c;
  allocator<char> local_1c1b;
  allocator<char> local_1c1a;
  allocator<char> local_1c19;
  allocator<char> local_1c18;
  allocator<char> local_1c17;
  allocator<char> local_1c16;
  allocator<char> local_1c15;
  allocator<char> local_1c14;
  allocator<char> local_1c13;
  allocator<char> local_1c12;
  allocator<char> local_1c11;
  allocator<char> local_1c10;
  allocator<char> local_1c0f;
  allocator<char> local_1c0e;
  allocator<char> local_1c0d;
  allocator<char> local_1c0c;
  allocator<char> local_1c0b;
  allocator<char> local_1c0a;
  allocator<char> local_1c09;
  allocator<char> local_1c08;
  allocator<char> local_1c07;
  allocator<char> local_1c06;
  allocator<char> local_1c05;
  allocator<char> local_1c04;
  allocator<char> local_1c03;
  allocator<char> local_1c02;
  allocator<char> local_1c01;
  allocator<char> local_1c00;
  allocator<char> local_1bff;
  allocator<char> local_1bfe;
  allocator<char> local_1bfd;
  allocator<char> local_1bfc;
  allocator<char> local_1bfb;
  allocator<char> local_1bfa;
  allocator<char> local_1bf9;
  allocator<char> local_1bf8;
  allocator<char> local_1bf7;
  allocator<char> local_1bf6;
  allocator<char> local_1bf5;
  allocator<char> local_1bf4;
  allocator<char> local_1bf3;
  allocator<char> local_1bf2;
  allocator<char> local_1bf1;
  allocator<char> local_1bf0;
  allocator<char> local_1bef;
  allocator<char> local_1bee;
  allocator<char> local_1bed;
  allocator<char> local_1bec;
  allocator<char> local_1beb;
  allocator<char> local_1bea;
  allocator<char> local_1be9;
  allocator<char> local_1be8;
  allocator<char> local_1be7;
  allocator<char> local_1be6;
  allocator<char> local_1be5;
  allocator<char> local_1be4;
  allocator<char> local_1be3;
  allocator<char> local_1be2;
  allocator<char> local_1be1;
  allocator<char> local_1be0;
  allocator<char> local_1bdf;
  allocator<char> local_1bde;
  allocator<char> local_1bdd;
  allocator<char> local_1bdc;
  allocator<char> local_1bdb;
  allocator<char> local_1bda;
  allocator<char> local_1bd9;
  allocator<char> local_1bd8;
  allocator<char> local_1bd7;
  allocator<char> local_1bd6;
  allocator<char> local_1bd5;
  allocator<char> local_1bd4;
  allocator<char> local_1bd3;
  allocator<char> local_1bd2;
  allocator<char> local_1bd1;
  allocator<char> local_1bd0;
  allocator<char> local_1bcf;
  allocator<char> local_1bce;
  allocator<char> local_1bcd;
  allocator<char> local_1bcc;
  allocator<char> local_1bcb;
  allocator<char> local_1bca;
  allocator<char> local_1bc9;
  allocator<char> local_1bc8;
  allocator<char> local_1bc7;
  allocator<char> local_1bc6;
  allocator<char> local_1bc5;
  allocator<char> local_1bc4;
  allocator<char> local_1bc3;
  allocator<char> local_1bc2;
  allocator<char> local_1bc1;
  allocator<char> local_1bc0;
  allocator<char> local_1bbf;
  allocator<char> local_1bbe;
  allocator<char> local_1bbd;
  allocator<char> local_1bbc;
  allocator<char> local_1bbb;
  allocator<char> local_1bba;
  allocator<char> local_1bb9;
  allocator<char> local_1bb8;
  allocator<char> local_1bb7;
  allocator<char> local_1bb6;
  allocator<char> local_1bb5;
  allocator<char> local_1bb4;
  allocator<char> local_1bb3;
  allocator<char> local_1bb2;
  allocator<char> local_1bb1;
  allocator<char> local_1bb0;
  allocator<char> local_1baf;
  allocator<char> local_1bae;
  allocator<char> local_1bad;
  allocator<char> local_1bac;
  allocator<char> local_1bab;
  allocator<char> local_1baa;
  allocator<char> local_1ba9;
  allocator<char> local_1ba8;
  allocator<char> local_1ba7;
  allocator<char> local_1ba6;
  allocator<char> local_1ba5;
  allocator<char> local_1ba4;
  allocator<char> local_1ba3;
  allocator<char> local_1ba2;
  allocator<char> local_1ba1;
  allocator<char> local_1ba0;
  allocator<char> local_1b9f;
  allocator<char> local_1b9e;
  allocator<char> local_1b9d;
  allocator<char> local_1b9c;
  allocator<char> local_1b9b;
  allocator<char> local_1b9a;
  allocator<char> local_1b99;
  allocator<char> local_1b98;
  allocator<char> local_1b97;
  allocator<char> local_1b96;
  allocator<char> local_1b95;
  allocator<char> local_1b94;
  allocator<char> local_1b93;
  allocator<char> local_1b92;
  allocator<char> local_1b91;
  allocator<char> local_1b90;
  allocator<char> local_1b8f;
  allocator<char> local_1b8e;
  allocator<char> local_1b8d;
  allocator<char> local_1b8c;
  allocator<char> local_1b8b;
  allocator<char> local_1b8a;
  allocator<char> local_1b89;
  allocator<char> local_1b88;
  allocator<char> local_1b87;
  allocator<char> local_1b86;
  allocator<char> local_1b85;
  allocator<char> local_1b84;
  allocator<char> local_1b83;
  allocator<char> local_1b82;
  allocator<char> local_1b81;
  allocator<char> local_1b80;
  allocator<char> local_1b7f;
  allocator<char> local_1b7e;
  allocator<char> local_1b7d;
  allocator<char> local_1b7c;
  allocator<char> local_1b7b;
  allocator<char> local_1b7a;
  allocator<char> local_1b79;
  allocator<char> local_1b78;
  allocator<char> local_1b77;
  allocator<char> local_1b76;
  allocator<char> local_1b75;
  allocator<char> local_1b74;
  allocator<char> local_1b73;
  allocator<char> local_1b72;
  allocator<char> local_1b71;
  allocator<char> local_1b70;
  allocator<char> local_1b6f;
  allocator<char> local_1b6e;
  allocator<char> local_1b6d;
  allocator<char> local_1b6c;
  allocator<char> local_1b6b;
  allocator<char> local_1b6a;
  allocator<char> local_1b69;
  allocator<char> local_1b68;
  allocator<char> local_1b67;
  allocator<char> local_1b66;
  allocator<char> local_1b65;
  allocator<char> local_1b64;
  allocator<char> local_1b63;
  allocator<char> local_1b62;
  allocator<char> local_1b61;
  allocator<char> local_1b60;
  allocator<char> local_1b5f;
  allocator<char> local_1b5e;
  allocator<char> local_1b5d;
  allocator<char> local_1b5c;
  allocator<char> local_1b5b;
  allocator<char> local_1b5a;
  allocator_type local_1b59;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vals;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b10;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1af8;
  undefined1 local_1ac0 [64];
  string local_1a80 [32];
  string local_1a60 [32];
  string local_1a40 [32];
  string local_1a20 [32];
  string local_1a00 [32];
  string local_19e0 [32];
  string local_19c0 [32];
  string local_19a0 [32];
  string local_1980 [32];
  string local_1960 [32];
  string local_1940 [32];
  string local_1920 [32];
  string local_1900 [32];
  string local_18e0 [32];
  string local_18c0 [32];
  string local_18a0 [32];
  string local_1880 [32];
  string local_1860 [32];
  string local_1840 [32];
  string local_1820 [32];
  string local_1800 [32];
  string local_17e0 [32];
  string local_17c0 [32];
  string local_17a0 [32];
  string local_1780 [32];
  string local_1760 [32];
  string local_1740 [32];
  string local_1720 [32];
  string local_1700 [32];
  string local_16e0 [32];
  string local_16c0 [32];
  string local_16a0 [32];
  string local_1680 [32];
  string local_1660 [32];
  string local_1640 [32];
  string local_1620 [32];
  string local_1600 [32];
  string local_15e0 [32];
  string local_15c0 [32];
  string local_15a0 [32];
  string local_1580 [32];
  string local_1560 [32];
  string local_1540 [32];
  string local_1520 [32];
  string local_1500 [32];
  string local_14e0 [32];
  string local_14c0 [32];
  string local_14a0 [32];
  string local_1480 [32];
  string local_1460 [32];
  string local_1440 [32];
  string local_1420 [32];
  string local_1400 [32];
  string local_13e0 [32];
  string local_13c0 [32];
  string local_13a0 [32];
  string local_1380 [32];
  string local_1360 [32];
  string local_1340 [32];
  string local_1320 [32];
  string local_1300 [32];
  string local_12e0 [32];
  string local_12c0 [32];
  string local_12a0 [32];
  string local_1280 [32];
  string local_1260 [32];
  string local_1240 [32];
  string local_1220 [32];
  string local_1200 [32];
  string local_11e0 [32];
  string local_11c0 [32];
  string local_11a0 [32];
  string local_1180 [32];
  string local_1160 [32];
  string local_1140 [32];
  string local_1120 [32];
  string local_1100 [32];
  string local_10e0 [32];
  string local_10c0 [32];
  string local_10a0 [32];
  string local_1080 [32];
  string local_1060 [32];
  string local_1040 [32];
  string local_1020 [32];
  string local_1000 [32];
  string local_fe0 [32];
  string local_fc0 [32];
  string local_fa0 [32];
  string local_f80 [32];
  string local_f60 [32];
  string local_f40 [32];
  string local_f20 [32];
  string local_f00 [32];
  string local_ee0 [32];
  string local_ec0 [32];
  string local_ea0 [32];
  string local_e80 [32];
  string local_e60 [32];
  string local_e40 [32];
  string local_e20 [32];
  string local_e00 [32];
  string local_de0 [32];
  string local_dc0 [32];
  string local_da0 [32];
  string local_d80 [32];
  string local_d60 [32];
  string local_d40 [32];
  string local_d20 [32];
  string local_d00 [32];
  string local_ce0 [32];
  string local_cc0 [32];
  string local_ca0 [32];
  string local_c80 [32];
  string local_c60 [32];
  string local_c40 [32];
  string local_c20 [32];
  string local_c00 [32];
  string local_be0 [32];
  string local_bc0 [32];
  string local_ba0 [32];
  string local_b80 [32];
  string local_b60 [32];
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [32];
  string local_ac0 [32];
  string local_aa0 [32];
  string local_a80 [32];
  string local_a60 [32];
  string local_a40 [32];
  string local_a20 [32];
  string local_a00 [32];
  string local_9e0 [32];
  string local_9c0 [32];
  string local_9a0 [32];
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  GetDefaultMap_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1ac0,"A",(allocator<char> *)&vals);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_1ac0 + 0x20),"A",&local_1b5a);
  std::__cxx11::string::string<std::allocator<char>>(local_1a80,"A",&local_1b5b);
  std::__cxx11::string::string<std::allocator<char>>(local_1a60,"A",&local_1b5c);
  std::__cxx11::string::string<std::allocator<char>>(local_1a40,"B",&local_1b5d);
  std::__cxx11::string::string<std::allocator<char>>(local_1a20,"U",&local_1b5e);
  std::__cxx11::string::string<std::allocator<char>>(local_1a00,"U",&local_1b5f);
  std::__cxx11::string::string<std::allocator<char>>(local_19e0,"O",&local_1b60);
  std::__cxx11::string::string<std::allocator<char>>(local_19c0,"O",&local_1b61);
  std::__cxx11::string::string<std::allocator<char>>(local_19a0,"A",&local_1b62);
  std::__cxx11::string::string<std::allocator<char>>(local_1980,"A",&local_1b63);
  std::__cxx11::string::string<std::allocator<char>>(local_1960,"A",&local_1b64);
  std::__cxx11::string::string<std::allocator<char>>(local_1940,"C",&local_1b65);
  std::__cxx11::string::string<std::allocator<char>>(local_1920,"D",&local_1b66);
  std::__cxx11::string::string<std::allocator<char>>(local_1900,"E",&local_1b67);
  std::__cxx11::string::string<std::allocator<char>>(local_18e0,"F",&local_1b68);
  std::__cxx11::string::string<std::allocator<char>>(local_18c0,"G",&local_1b69);
  std::__cxx11::string::string<std::allocator<char>>(local_18a0,"H",&local_1b6a);
  std::__cxx11::string::string<std::allocator<char>>(local_1880,"I",&local_1b6b);
  std::__cxx11::string::string<std::allocator<char>>(local_1860,"J",&local_1b6c);
  std::__cxx11::string::string<std::allocator<char>>(local_1840,"K",&local_1b6d);
  std::__cxx11::string::string<std::allocator<char>>(local_1820,"L",&local_1b6e);
  std::__cxx11::string::string<std::allocator<char>>(local_1800,"M",&local_1b6f);
  std::__cxx11::string::string<std::allocator<char>>(local_17e0,"N",&local_1b70);
  std::__cxx11::string::string<std::allocator<char>>(local_17c0,"O",&local_1b71);
  std::__cxx11::string::string<std::allocator<char>>(local_17a0,"P",&local_1b72);
  std::__cxx11::string::string<std::allocator<char>>(local_1780,"Q",&local_1b73);
  std::__cxx11::string::string<std::allocator<char>>(local_1760,"R",&local_1b74);
  std::__cxx11::string::string<std::allocator<char>>(local_1740,"S",&local_1b75);
  std::__cxx11::string::string<std::allocator<char>>(local_1720,"T",&local_1b76);
  std::__cxx11::string::string<std::allocator<char>>(local_1700,"U",&local_1b77);
  std::__cxx11::string::string<std::allocator<char>>(local_16e0,"V",&local_1b78);
  std::__cxx11::string::string<std::allocator<char>>(local_16c0,"W",&local_1b79);
  std::__cxx11::string::string<std::allocator<char>>(local_16a0,"X",&local_1b7a);
  std::__cxx11::string::string<std::allocator<char>>(local_1680,"Y",&local_1b7b);
  std::__cxx11::string::string<std::allocator<char>>(local_1660,"Z",&local_1b7c);
  std::__cxx11::string::string<std::allocator<char>>(local_1640,"A",&local_1b7d);
  std::__cxx11::string::string<std::allocator<char>>(local_1620,"B",&local_1b7e);
  std::__cxx11::string::string<std::allocator<char>>(local_1600,"C",&local_1b7f);
  std::__cxx11::string::string<std::allocator<char>>(local_15e0,"D",&local_1b80);
  std::__cxx11::string::string<std::allocator<char>>(local_15c0,"E",&local_1b81);
  std::__cxx11::string::string<std::allocator<char>>(local_15a0,"F",&local_1b82);
  std::__cxx11::string::string<std::allocator<char>>(local_1580,"G",&local_1b83);
  std::__cxx11::string::string<std::allocator<char>>(local_1560,"H",&local_1b84);
  std::__cxx11::string::string<std::allocator<char>>(local_1540,"I",&local_1b85);
  std::__cxx11::string::string<std::allocator<char>>(local_1520,"J",&local_1b86);
  std::__cxx11::string::string<std::allocator<char>>(local_1500,"K",&local_1b87);
  std::__cxx11::string::string<std::allocator<char>>(local_14e0,"L",&local_1b88);
  std::__cxx11::string::string<std::allocator<char>>(local_14c0,"M",&local_1b89);
  std::__cxx11::string::string<std::allocator<char>>(local_14a0,"N",&local_1b8a);
  std::__cxx11::string::string<std::allocator<char>>(local_1480,"O",&local_1b8b);
  std::__cxx11::string::string<std::allocator<char>>(local_1460,"P",&local_1b8c);
  std::__cxx11::string::string<std::allocator<char>>(local_1440,"Q",&local_1b8d);
  std::__cxx11::string::string<std::allocator<char>>(local_1420,"R",&local_1b8e);
  std::__cxx11::string::string<std::allocator<char>>(local_1400,"S",&local_1b8f);
  std::__cxx11::string::string<std::allocator<char>>(local_13e0,"T",&local_1b90);
  std::__cxx11::string::string<std::allocator<char>>(local_13c0,"U",&local_1b91);
  std::__cxx11::string::string<std::allocator<char>>(local_13a0,"V",&local_1b92);
  std::__cxx11::string::string<std::allocator<char>>(local_1380,"W",&local_1b93);
  std::__cxx11::string::string<std::allocator<char>>(local_1360,"X",&local_1b94);
  std::__cxx11::string::string<std::allocator<char>>(local_1340,"Y",&local_1b95);
  std::__cxx11::string::string<std::allocator<char>>(local_1320,"Z",&local_1b96);
  std::__cxx11::string::string<std::allocator<char>>(local_1300,"0",&local_1b97);
  std::__cxx11::string::string<std::allocator<char>>(local_12e0,"A",&local_1b98);
  std::__cxx11::string::string<std::allocator<char>>(local_12c0,"B",&local_1b99);
  std::__cxx11::string::string<std::allocator<char>>(local_12a0,"C",&local_1b9a);
  std::__cxx11::string::string<std::allocator<char>>(local_1280,"D",&local_1b9b);
  std::__cxx11::string::string<std::allocator<char>>(local_1260,"E",&local_1b9c);
  std::__cxx11::string::string<std::allocator<char>>(local_1240,"F",&local_1b9d);
  std::__cxx11::string::string<std::allocator<char>>(local_1220,"G",&local_1b9e);
  std::__cxx11::string::string<std::allocator<char>>(local_1200,"H",&local_1b9f);
  std::__cxx11::string::string<std::allocator<char>>(local_11e0,"I",&local_1ba0);
  std::__cxx11::string::string<std::allocator<char>>(local_11c0,"J",&local_1ba1);
  std::__cxx11::string::string<std::allocator<char>>(local_11a0,"K",&local_1ba2);
  std::__cxx11::string::string<std::allocator<char>>(local_1180,"L",&local_1ba3);
  std::__cxx11::string::string<std::allocator<char>>(local_1160,"M",&local_1ba4);
  std::__cxx11::string::string<std::allocator<char>>(local_1140,"N",&local_1ba5);
  std::__cxx11::string::string<std::allocator<char>>(local_1120,"O",&local_1ba6);
  std::__cxx11::string::string<std::allocator<char>>(local_1100,"P",&local_1ba7);
  std::__cxx11::string::string<std::allocator<char>>(local_10e0,"Q",&local_1ba8);
  std::__cxx11::string::string<std::allocator<char>>(local_10c0,"R",&local_1ba9);
  std::__cxx11::string::string<std::allocator<char>>(local_10a0,"S",&local_1baa);
  std::__cxx11::string::string<std::allocator<char>>(local_1080,"T",&local_1bab);
  std::__cxx11::string::string<std::allocator<char>>(local_1060,"U",&local_1bac);
  std::__cxx11::string::string<std::allocator<char>>(local_1040,"V",&local_1bad);
  std::__cxx11::string::string<std::allocator<char>>(local_1020,"W",&local_1bae);
  std::__cxx11::string::string<std::allocator<char>>(local_1000,"X",&local_1baf);
  std::__cxx11::string::string<std::allocator<char>>(local_fe0,"Y",&local_1bb0);
  std::__cxx11::string::string<std::allocator<char>>(local_fc0,"Z",&local_1bb1);
  std::__cxx11::string::string<std::allocator<char>>(local_fa0,"A",&local_1bb2);
  std::__cxx11::string::string<std::allocator<char>>(local_f80,"B",&local_1bb3);
  std::__cxx11::string::string<std::allocator<char>>(local_f60,"C",&local_1bb4);
  std::__cxx11::string::string<std::allocator<char>>(local_f40,"D",&local_1bb5);
  std::__cxx11::string::string<std::allocator<char>>(local_f20,"E",&local_1bb6);
  std::__cxx11::string::string<std::allocator<char>>(local_f00,"F",&local_1bb7);
  std::__cxx11::string::string<std::allocator<char>>(local_ee0,"G",&local_1bb8);
  std::__cxx11::string::string<std::allocator<char>>(local_ec0,"H",&local_1bb9);
  std::__cxx11::string::string<std::allocator<char>>(local_ea0,"I",&local_1bba);
  std::__cxx11::string::string<std::allocator<char>>(local_e80,"J",&local_1bbb);
  std::__cxx11::string::string<std::allocator<char>>(local_e60,"K",&local_1bbc);
  std::__cxx11::string::string<std::allocator<char>>(local_e40,"L",&local_1bbd);
  std::__cxx11::string::string<std::allocator<char>>(local_e20,"M",&local_1bbe);
  std::__cxx11::string::string<std::allocator<char>>(local_e00,"N",&local_1bbf);
  std::__cxx11::string::string<std::allocator<char>>(local_de0,"O",&local_1bc0);
  std::__cxx11::string::string<std::allocator<char>>(local_dc0,"P",&local_1bc1);
  std::__cxx11::string::string<std::allocator<char>>(local_da0,"Q",&local_1bc2);
  std::__cxx11::string::string<std::allocator<char>>(local_d80,"R",&local_1bc3);
  std::__cxx11::string::string<std::allocator<char>>(local_d60,"S",&local_1bc4);
  std::__cxx11::string::string<std::allocator<char>>(local_d40,"T",&local_1bc5);
  std::__cxx11::string::string<std::allocator<char>>(local_d20,"U",&local_1bc6);
  std::__cxx11::string::string<std::allocator<char>>(local_d00,"V",&local_1bc7);
  std::__cxx11::string::string<std::allocator<char>>(local_ce0,"W",&local_1bc8);
  std::__cxx11::string::string<std::allocator<char>>(local_cc0,"X",&local_1bc9);
  std::__cxx11::string::string<std::allocator<char>>(local_ca0,"Y",&local_1bca);
  std::__cxx11::string::string<std::allocator<char>>(local_c80,"Z",&local_1bcb);
  std::__cxx11::string::string<std::allocator<char>>(local_c60,"A",&local_1bcc);
  std::__cxx11::string::string<std::allocator<char>>(local_c40,"B",&local_1bcd);
  std::__cxx11::string::string<std::allocator<char>>(local_c20,"C",&local_1bce);
  std::__cxx11::string::string<std::allocator<char>>(local_c00,"D",&local_1bcf);
  std::__cxx11::string::string<std::allocator<char>>(local_be0,"E",&local_1bd0);
  std::__cxx11::string::string<std::allocator<char>>(local_bc0,"F",&local_1bd1);
  std::__cxx11::string::string<std::allocator<char>>(local_ba0,"G",&local_1bd2);
  std::__cxx11::string::string<std::allocator<char>>(local_b80,"H",&local_1bd3);
  std::__cxx11::string::string<std::allocator<char>>(local_b60,"I",&local_1bd4);
  std::__cxx11::string::string<std::allocator<char>>(local_b40,"J",&local_1bd5);
  std::__cxx11::string::string<std::allocator<char>>(local_b20,"K",&local_1bd6);
  std::__cxx11::string::string<std::allocator<char>>(local_b00,"L",&local_1bd7);
  std::__cxx11::string::string<std::allocator<char>>(local_ae0,"M",&local_1bd8);
  std::__cxx11::string::string<std::allocator<char>>(local_ac0,"N",&local_1bd9);
  std::__cxx11::string::string<std::allocator<char>>(local_aa0,"O",&local_1bda);
  std::__cxx11::string::string<std::allocator<char>>(local_a80,"P",&local_1bdb);
  std::__cxx11::string::string<std::allocator<char>>(local_a60,"Q",&local_1bdc);
  std::__cxx11::string::string<std::allocator<char>>(local_a40,"R",&local_1bdd);
  std::__cxx11::string::string<std::allocator<char>>(local_a20,"S",&local_1bde);
  std::__cxx11::string::string<std::allocator<char>>(local_a00,"T",&local_1bdf);
  std::__cxx11::string::string<std::allocator<char>>(local_9e0,"U",&local_1be0);
  std::__cxx11::string::string<std::allocator<char>>(local_9c0,"V",&local_1be1);
  std::__cxx11::string::string<std::allocator<char>>(local_9a0,"W",&local_1be2);
  std::__cxx11::string::string<std::allocator<char>>(local_980,"X",&local_1be3);
  std::__cxx11::string::string<std::allocator<char>>(local_960,"Y",&local_1be4);
  std::__cxx11::string::string<std::allocator<char>>(local_940,"Z",&local_1be5);
  std::__cxx11::string::string<std::allocator<char>>(local_920,"A",&local_1be6);
  std::__cxx11::string::string<std::allocator<char>>(local_900,"B",&local_1be7);
  std::__cxx11::string::string<std::allocator<char>>(local_8e0,"C",&local_1be8);
  std::__cxx11::string::string<std::allocator<char>>(local_8c0,"D",&local_1be9);
  std::__cxx11::string::string<std::allocator<char>>(local_8a0,"E",&local_1bea);
  std::__cxx11::string::string<std::allocator<char>>(local_880,"F",&local_1beb);
  std::__cxx11::string::string<std::allocator<char>>(local_860,"G",&local_1bec);
  std::__cxx11::string::string<std::allocator<char>>(local_840,"H",&local_1bed);
  std::__cxx11::string::string<std::allocator<char>>(local_820,"I",&local_1bee);
  std::__cxx11::string::string<std::allocator<char>>(local_800,"J",&local_1bef);
  std::__cxx11::string::string<std::allocator<char>>(local_7e0,"K",&local_1bf0);
  std::__cxx11::string::string<std::allocator<char>>(local_7c0,"L",&local_1bf1);
  std::__cxx11::string::string<std::allocator<char>>(local_7a0,"M",&local_1bf2);
  std::__cxx11::string::string<std::allocator<char>>(local_780,"N",&local_1bf3);
  std::__cxx11::string::string<std::allocator<char>>(local_760,"O",&local_1bf4);
  std::__cxx11::string::string<std::allocator<char>>(local_740,"P",&local_1bf5);
  std::__cxx11::string::string<std::allocator<char>>(local_720,"Q",&local_1bf6);
  std::__cxx11::string::string<std::allocator<char>>(local_700,"R",&local_1bf7);
  std::__cxx11::string::string<std::allocator<char>>(local_6e0,"S",&local_1bf8);
  std::__cxx11::string::string<std::allocator<char>>(local_6c0,"T",&local_1bf9);
  std::__cxx11::string::string<std::allocator<char>>(local_6a0,"U",&local_1bfa);
  std::__cxx11::string::string<std::allocator<char>>(local_680,"V",&local_1bfb);
  std::__cxx11::string::string<std::allocator<char>>(local_660,"W",&local_1bfc);
  std::__cxx11::string::string<std::allocator<char>>(local_640,"X",&local_1bfd);
  std::__cxx11::string::string<std::allocator<char>>(local_620,"Y",&local_1bfe);
  std::__cxx11::string::string<std::allocator<char>>(local_600,"Z",&local_1bff);
  std::__cxx11::string::string<std::allocator<char>>(local_5e0,"A",&local_1c00);
  std::__cxx11::string::string<std::allocator<char>>(local_5c0,"B",&local_1c01);
  std::__cxx11::string::string<std::allocator<char>>(local_5a0,"C",&local_1c02);
  std::__cxx11::string::string<std::allocator<char>>(local_580,"D",&local_1c03);
  std::__cxx11::string::string<std::allocator<char>>(local_560,"E",&local_1c04);
  std::__cxx11::string::string<std::allocator<char>>(local_540,"F",&local_1c05);
  std::__cxx11::string::string<std::allocator<char>>(local_520,"G",&local_1c06);
  std::__cxx11::string::string<std::allocator<char>>(local_500,"H",&local_1c07);
  std::__cxx11::string::string<std::allocator<char>>(local_4e0,"I",&local_1c08);
  std::__cxx11::string::string<std::allocator<char>>(local_4c0,"J",&local_1c09);
  std::__cxx11::string::string<std::allocator<char>>(local_4a0,"K",&local_1c0a);
  std::__cxx11::string::string<std::allocator<char>>(local_480,"L",&local_1c0b);
  std::__cxx11::string::string<std::allocator<char>>(local_460,"M",&local_1c0c);
  std::__cxx11::string::string<std::allocator<char>>(local_440,"N",&local_1c0d);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"O",&local_1c0e);
  std::__cxx11::string::string<std::allocator<char>>(local_400,"P",&local_1c0f);
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"Q",&local_1c10);
  std::__cxx11::string::string<std::allocator<char>>(local_3c0,"R",&local_1c11);
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"S",&local_1c12);
  std::__cxx11::string::string<std::allocator<char>>(local_380,"T",&local_1c13);
  std::__cxx11::string::string<std::allocator<char>>(local_360,"U",&local_1c14);
  std::__cxx11::string::string<std::allocator<char>>(local_340,"V",&local_1c15);
  std::__cxx11::string::string<std::allocator<char>>(local_320,"W",&local_1c16);
  std::__cxx11::string::string<std::allocator<char>>(local_300,"X",&local_1c17);
  std::__cxx11::string::string<std::allocator<char>>(local_2e0,"Y",&local_1c18);
  std::__cxx11::string::string<std::allocator<char>>(local_2c0,"Z",&local_1c19);
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"U",&local_1c1a);
  std::__cxx11::string::string<std::allocator<char>>(local_280,"A",&local_1c1b);
  std::__cxx11::string::string<std::allocator<char>>(local_260," ",&local_1c1c);
  std::__cxx11::string::string<std::allocator<char>>(local_240,"S",&local_1c1d);
  std::__cxx11::string::string<std::allocator<char>>(local_220,"M",&local_1c1e);
  std::__cxx11::string::string<std::allocator<char>>(local_200,"O",&local_1c1f);
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"L",&local_1c20);
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"N",&local_1c21);
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"A",&local_1c22);
  std::__cxx11::string::string<std::allocator<char>>(local_180,"T",&local_1c23);
  std::__cxx11::string::string<std::allocator<char>>(local_160,"I",&local_1c24);
  std::__cxx11::string::string<std::allocator<char>>(local_140,"O",&local_1c25);
  std::__cxx11::string::string<std::allocator<char>>(local_120,"N",&local_1c26);
  std::__cxx11::string::string<std::allocator<char>>(local_100,"N",&local_1c27);
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"I",&local_1c28);
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"G",&local_1c29);
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"N",&local_1c2a);
  std::__cxx11::string::string<std::allocator<char>>(local_80,"I",&local_1c2b);
  std::__cxx11::string::string<std::allocator<char>>(local_60,"FREE",&local_1c2c);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"AE",&local_1c2d);
  __l._M_len = 0xd5;
  __l._M_array = (iterator)local_1ac0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&keys,__l,&local_1c2e);
  lVar1 = 0x1a80;
  do {
    std::__cxx11::string::~string((string *)(local_1ac0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1ac0,anon_var_dwarf_15305,&local_1b5a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_1ac0 + 0x20),anon_var_dwarf_15311,&local_1b5b);
  std::__cxx11::string::string<std::allocator<char>>(local_1a80,anon_var_dwarf_1531d,&local_1b5c);
  std::__cxx11::string::string<std::allocator<char>>(local_1a60,anon_var_dwarf_15329,&local_1b5d);
  std::__cxx11::string::string<std::allocator<char>>(local_1a40,anon_var_dwarf_15335,&local_1b5e);
  std::__cxx11::string::string<std::allocator<char>>(local_1a20,anon_var_dwarf_15341,&local_1b5f);
  std::__cxx11::string::string<std::allocator<char>>(local_1a00,anon_var_dwarf_1534d,&local_1b60);
  std::__cxx11::string::string<std::allocator<char>>(local_19e0,anon_var_dwarf_15359,&local_1b61);
  std::__cxx11::string::string<std::allocator<char>>(local_19c0,anon_var_dwarf_15365,&local_1b62);
  std::__cxx11::string::string<std::allocator<char>>(local_19a0,anon_var_dwarf_15371,&local_1b63);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1980,anon_var_dwarf_15ca7 + 0xf,&local_1b64);
  std::__cxx11::string::string<std::allocator<char>>(local_1960,anon_var_dwarf_15389,&local_1b65);
  std::__cxx11::string::string<std::allocator<char>>(local_1940,anon_var_dwarf_15395,&local_1b66);
  std::__cxx11::string::string<std::allocator<char>>(local_1920,anon_var_dwarf_153a1,&local_1b67);
  std::__cxx11::string::string<std::allocator<char>>(local_1900,anon_var_dwarf_153ad,&local_1b68);
  std::__cxx11::string::string<std::allocator<char>>(local_18e0,anon_var_dwarf_153b9,&local_1b69);
  std::__cxx11::string::string<std::allocator<char>>(local_18c0,anon_var_dwarf_153c5,&local_1b6a);
  std::__cxx11::string::string<std::allocator<char>>(local_18a0,anon_var_dwarf_153d1,&local_1b6b);
  std::__cxx11::string::string<std::allocator<char>>(local_1880,anon_var_dwarf_153dd,&local_1b6c);
  std::__cxx11::string::string<std::allocator<char>>(local_1860,anon_var_dwarf_153e9,&local_1b6d);
  std::__cxx11::string::string<std::allocator<char>>(local_1840,anon_var_dwarf_153f5,&local_1b6e);
  std::__cxx11::string::string<std::allocator<char>>(local_1820,anon_var_dwarf_15401,&local_1b6f);
  std::__cxx11::string::string<std::allocator<char>>(local_1800,anon_var_dwarf_1540d,&local_1b70);
  std::__cxx11::string::string<std::allocator<char>>(local_17e0,anon_var_dwarf_15419,&local_1b71);
  std::__cxx11::string::string<std::allocator<char>>(local_17c0,anon_var_dwarf_15425,&local_1b72);
  std::__cxx11::string::string<std::allocator<char>>(local_17a0,anon_var_dwarf_15431,&local_1b73);
  std::__cxx11::string::string<std::allocator<char>>(local_1780,anon_var_dwarf_1543d,&local_1b74);
  std::__cxx11::string::string<std::allocator<char>>(local_1760,anon_var_dwarf_15449,&local_1b75);
  std::__cxx11::string::string<std::allocator<char>>(local_1740,anon_var_dwarf_15455,&local_1b76);
  std::__cxx11::string::string<std::allocator<char>>(local_1720,anon_var_dwarf_15461,&local_1b77);
  std::__cxx11::string::string<std::allocator<char>>(local_1700,anon_var_dwarf_1546d,&local_1b78);
  std::__cxx11::string::string<std::allocator<char>>(local_16e0,anon_var_dwarf_15479,&local_1b79);
  std::__cxx11::string::string<std::allocator<char>>(local_16c0,anon_var_dwarf_15485,&local_1b7a);
  std::__cxx11::string::string<std::allocator<char>>(local_16a0,anon_var_dwarf_15491,&local_1b7b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1680,anon_var_dwarf_15cbf + 0x60,&local_1b7c);
  std::__cxx11::string::string<std::allocator<char>>(local_1660,anon_var_dwarf_154a9,&local_1b7d);
  std::__cxx11::string::string<std::allocator<char>>(local_1640,anon_var_dwarf_154b5,&local_1b7e);
  std::__cxx11::string::string<std::allocator<char>>(local_1620,anon_var_dwarf_154c1,&local_1b7f);
  std::__cxx11::string::string<std::allocator<char>>(local_1600,anon_var_dwarf_154cd,&local_1b80);
  std::__cxx11::string::string<std::allocator<char>>(local_15e0,anon_var_dwarf_154d9,&local_1b81);
  std::__cxx11::string::string<std::allocator<char>>(local_15c0,anon_var_dwarf_154e5,&local_1b82);
  std::__cxx11::string::string<std::allocator<char>>(local_15a0,anon_var_dwarf_154f1,&local_1b83);
  std::__cxx11::string::string<std::allocator<char>>(local_1580,anon_var_dwarf_154fd,&local_1b84);
  std::__cxx11::string::string<std::allocator<char>>(local_1560,anon_var_dwarf_15509,&local_1b85);
  std::__cxx11::string::string<std::allocator<char>>(local_1540,anon_var_dwarf_15515,&local_1b86);
  std::__cxx11::string::string<std::allocator<char>>(local_1520,anon_var_dwarf_15521,&local_1b87);
  std::__cxx11::string::string<std::allocator<char>>(local_1500,anon_var_dwarf_1552d,&local_1b88);
  std::__cxx11::string::string<std::allocator<char>>(local_14e0,anon_var_dwarf_15539,&local_1b89);
  std::__cxx11::string::string<std::allocator<char>>(local_14c0,anon_var_dwarf_15545,&local_1b8a);
  std::__cxx11::string::string<std::allocator<char>>(local_14a0,anon_var_dwarf_15551,&local_1b8b);
  std::__cxx11::string::string<std::allocator<char>>(local_1480,anon_var_dwarf_1555d,&local_1b8c);
  std::__cxx11::string::string<std::allocator<char>>(local_1460,anon_var_dwarf_15569,&local_1b8d);
  std::__cxx11::string::string<std::allocator<char>>(local_1440,anon_var_dwarf_15575,&local_1b8e);
  std::__cxx11::string::string<std::allocator<char>>(local_1420,anon_var_dwarf_15581,&local_1b8f);
  std::__cxx11::string::string<std::allocator<char>>(local_1400,anon_var_dwarf_1558d,&local_1b90);
  std::__cxx11::string::string<std::allocator<char>>(local_13e0,anon_var_dwarf_15599,&local_1b91);
  std::__cxx11::string::string<std::allocator<char>>(local_13c0,anon_var_dwarf_155a5,&local_1b92);
  std::__cxx11::string::string<std::allocator<char>>(local_13a0,anon_var_dwarf_155b1,&local_1b93);
  std::__cxx11::string::string<std::allocator<char>>(local_1380,anon_var_dwarf_155bd,&local_1b94);
  std::__cxx11::string::string<std::allocator<char>>(local_1360,anon_var_dwarf_155c9,&local_1b95);
  std::__cxx11::string::string<std::allocator<char>>(local_1340,anon_var_dwarf_155d5,&local_1b96);
  std::__cxx11::string::string<std::allocator<char>>(local_1320,anon_var_dwarf_155e1,&local_1b97);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1300,anon_var_dwarf_15cf3 + 0x51,&local_1b98);
  std::__cxx11::string::string<std::allocator<char>>(local_12e0,anon_var_dwarf_155f9,&local_1b99);
  std::__cxx11::string::string<std::allocator<char>>(local_12c0,anon_var_dwarf_15605,&local_1b9a);
  std::__cxx11::string::string<std::allocator<char>>(local_12a0,anon_var_dwarf_15611,&local_1b9b);
  std::__cxx11::string::string<std::allocator<char>>(local_1280,anon_var_dwarf_1561d,&local_1b9c);
  std::__cxx11::string::string<std::allocator<char>>(local_1260,anon_var_dwarf_148d7,&local_1b9d);
  std::__cxx11::string::string<std::allocator<char>>(local_1240,anon_var_dwarf_15629,&local_1b9e);
  std::__cxx11::string::string<std::allocator<char>>(local_1220,anon_var_dwarf_145b3,&local_1b9f);
  std::__cxx11::string::string<std::allocator<char>>(local_1200,anon_var_dwarf_15635,&local_1ba0);
  std::__cxx11::string::string<std::allocator<char>>(local_11e0,anon_var_dwarf_13c5f,&local_1ba1);
  std::__cxx11::string::string<std::allocator<char>>(local_11c0,anon_var_dwarf_15641,&local_1ba2);
  std::__cxx11::string::string<std::allocator<char>>(local_11a0,anon_var_dwarf_1564d,&local_1ba3);
  std::__cxx11::string::string<std::allocator<char>>(local_1180,anon_var_dwarf_15659,&local_1ba4);
  std::__cxx11::string::string<std::allocator<char>>(local_1160,anon_var_dwarf_15665,&local_1ba5);
  std::__cxx11::string::string<std::allocator<char>>(local_1140,anon_var_dwarf_137d8,&local_1ba6);
  std::__cxx11::string::string<std::allocator<char>>(local_1120,anon_var_dwarf_15671,&local_1ba7);
  std::__cxx11::string::string<std::allocator<char>>(local_1100,anon_var_dwarf_1567d,&local_1ba8);
  std::__cxx11::string::string<std::allocator<char>>(local_10e0,anon_var_dwarf_15689,&local_1ba9);
  std::__cxx11::string::string<std::allocator<char>>(local_10c0,anon_var_dwarf_14ecb,&local_1baa);
  std::__cxx11::string::string<std::allocator<char>>(local_10a0,anon_var_dwarf_15695,&local_1bab);
  std::__cxx11::string::string<std::allocator<char>>(local_1080,anon_var_dwarf_156a1,&local_1bac);
  std::__cxx11::string::string<std::allocator<char>>(local_1060,anon_var_dwarf_156ad,&local_1bad);
  std::__cxx11::string::string<std::allocator<char>>(local_1040,anon_var_dwarf_156b9,&local_1bae);
  std::__cxx11::string::string<std::allocator<char>>(local_1020,anon_var_dwarf_156c5,&local_1baf);
  std::__cxx11::string::string<std::allocator<char>>(local_1000,anon_var_dwarf_156d1,&local_1bb0);
  std::__cxx11::string::string<std::allocator<char>>(local_fe0,anon_var_dwarf_13df7,&local_1bb1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_fc0,anon_var_dwarf_15d27 + 100,&local_1bb2);
  std::__cxx11::string::string<std::allocator<char>>(local_fa0,anon_var_dwarf_156e9,&local_1bb3);
  std::__cxx11::string::string<std::allocator<char>>(local_f80,anon_var_dwarf_156f5,&local_1bb4);
  std::__cxx11::string::string<std::allocator<char>>(local_f60,anon_var_dwarf_15701,&local_1bb5);
  std::__cxx11::string::string<std::allocator<char>>(local_f40,anon_var_dwarf_1570d,&local_1bb6);
  std::__cxx11::string::string<std::allocator<char>>(local_f20,anon_var_dwarf_15719,&local_1bb7);
  std::__cxx11::string::string<std::allocator<char>>(local_f00,anon_var_dwarf_15725,&local_1bb8);
  std::__cxx11::string::string<std::allocator<char>>(local_ee0,anon_var_dwarf_15731,&local_1bb9);
  std::__cxx11::string::string<std::allocator<char>>(local_ec0,anon_var_dwarf_1573d,&local_1bba);
  std::__cxx11::string::string<std::allocator<char>>(local_ea0,anon_var_dwarf_15749,&local_1bbb);
  std::__cxx11::string::string<std::allocator<char>>(local_e80,anon_var_dwarf_15755,&local_1bbc);
  std::__cxx11::string::string<std::allocator<char>>(local_e60,anon_var_dwarf_15761,&local_1bbd);
  std::__cxx11::string::string<std::allocator<char>>(local_e40,anon_var_dwarf_1576d,&local_1bbe);
  std::__cxx11::string::string<std::allocator<char>>(local_e20,anon_var_dwarf_15779,&local_1bbf);
  std::__cxx11::string::string<std::allocator<char>>(local_e00,anon_var_dwarf_15785,&local_1bc0);
  std::__cxx11::string::string<std::allocator<char>>(local_de0,anon_var_dwarf_15791,&local_1bc1);
  std::__cxx11::string::string<std::allocator<char>>(local_dc0,anon_var_dwarf_1579d,&local_1bc2);
  std::__cxx11::string::string<std::allocator<char>>(local_da0,anon_var_dwarf_157a9,&local_1bc3);
  std::__cxx11::string::string<std::allocator<char>>(local_d80,anon_var_dwarf_157b5,&local_1bc4);
  std::__cxx11::string::string<std::allocator<char>>(local_d60,anon_var_dwarf_157c1,&local_1bc5);
  std::__cxx11::string::string<std::allocator<char>>(local_d40,anon_var_dwarf_157cd,&local_1bc6);
  std::__cxx11::string::string<std::allocator<char>>(local_d20,anon_var_dwarf_157d9,&local_1bc7);
  std::__cxx11::string::string<std::allocator<char>>(local_d00,anon_var_dwarf_157e5,&local_1bc8);
  std::__cxx11::string::string<std::allocator<char>>(local_ce0,anon_var_dwarf_157f1,&local_1bc9);
  std::__cxx11::string::string<std::allocator<char>>(local_cc0,anon_var_dwarf_157fd,&local_1bca);
  std::__cxx11::string::string<std::allocator<char>>(local_ca0,anon_var_dwarf_15809,&local_1bcb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c80,anon_var_dwarf_15d5b + 100,&local_1bcc);
  std::__cxx11::string::string<std::allocator<char>>(local_c60,anon_var_dwarf_15821,&local_1bcd);
  std::__cxx11::string::string<std::allocator<char>>(local_c40,anon_var_dwarf_1582d,&local_1bce);
  std::__cxx11::string::string<std::allocator<char>>(local_c20,anon_var_dwarf_15839,&local_1bcf);
  std::__cxx11::string::string<std::allocator<char>>(local_c00,anon_var_dwarf_15845,&local_1bd0);
  std::__cxx11::string::string<std::allocator<char>>(local_be0,anon_var_dwarf_14b23,&local_1bd1);
  std::__cxx11::string::string<std::allocator<char>>(local_bc0,anon_var_dwarf_15851,&local_1bd2);
  std::__cxx11::string::string<std::allocator<char>>(local_ba0,anon_var_dwarf_1585d,&local_1bd3);
  std::__cxx11::string::string<std::allocator<char>>(local_b80,anon_var_dwarf_15869,&local_1bd4);
  std::__cxx11::string::string<std::allocator<char>>(local_b60,anon_var_dwarf_15875,&local_1bd5);
  std::__cxx11::string::string<std::allocator<char>>(local_b40,"J",&local_1bd6);
  std::__cxx11::string::string<std::allocator<char>>(local_b20,anon_var_dwarf_15881,&local_1bd7);
  std::__cxx11::string::string<std::allocator<char>>(local_b00,anon_var_dwarf_1588d,&local_1bd8);
  std::__cxx11::string::string<std::allocator<char>>(local_ae0,anon_var_dwarf_15899,&local_1bd9);
  std::__cxx11::string::string<std::allocator<char>>(local_ac0,anon_var_dwarf_1399b,&local_1bda);
  std::__cxx11::string::string<std::allocator<char>>(local_aa0,anon_var_dwarf_158a5,&local_1bdb);
  std::__cxx11::string::string<std::allocator<char>>(local_a80,anon_var_dwarf_158b1,&local_1bdc);
  std::__cxx11::string::string<std::allocator<char>>(local_a60,"Q",&local_1bdd);
  std::__cxx11::string::string<std::allocator<char>>(local_a40,anon_var_dwarf_150db,&local_1bde);
  std::__cxx11::string::string<std::allocator<char>>(local_a20,anon_var_dwarf_158bd,&local_1bdf);
  std::__cxx11::string::string<std::allocator<char>>(local_a00,anon_var_dwarf_158c9,&local_1be0);
  std::__cxx11::string::string<std::allocator<char>>(local_9e0,anon_var_dwarf_158d5,&local_1be1);
  std::__cxx11::string::string<std::allocator<char>>(local_9c0,"V",&local_1be2);
  std::__cxx11::string::string<std::allocator<char>>(local_9a0,anon_var_dwarf_158e1,&local_1be3);
  std::__cxx11::string::string<std::allocator<char>>(local_980,anon_var_dwarf_158ed,&local_1be4);
  std::__cxx11::string::string<std::allocator<char>>(local_960,anon_var_dwarf_1405b,&local_1be5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_940,anon_var_dwarf_15d67 + 0x3e,&local_1be6);
  std::__cxx11::string::string<std::allocator<char>>(local_920,anon_var_dwarf_15905,&local_1be7);
  std::__cxx11::string::string<std::allocator<char>>(local_900,anon_var_dwarf_15911,&local_1be8);
  std::__cxx11::string::string<std::allocator<char>>(local_8e0,anon_var_dwarf_1591d,&local_1be9);
  std::__cxx11::string::string<std::allocator<char>>(local_8c0,anon_var_dwarf_15929,&local_1bea);
  std::__cxx11::string::string<std::allocator<char>>(local_8a0,anon_var_dwarf_148e3,&local_1beb);
  std::__cxx11::string::string<std::allocator<char>>(local_880,anon_var_dwarf_15935,&local_1bec);
  std::__cxx11::string::string<std::allocator<char>>(local_860,anon_var_dwarf_145bf,&local_1bed);
  std::__cxx11::string::string<std::allocator<char>>(local_840,anon_var_dwarf_15941,&local_1bee);
  std::__cxx11::string::string<std::allocator<char>>(local_820,anon_var_dwarf_13c6b,&local_1bef);
  std::__cxx11::string::string<std::allocator<char>>(local_800,anon_var_dwarf_1594d,&local_1bf0);
  std::__cxx11::string::string<std::allocator<char>>(local_7e0,anon_var_dwarf_15959,&local_1bf1);
  std::__cxx11::string::string<std::allocator<char>>(local_7c0,anon_var_dwarf_15965,&local_1bf2);
  std::__cxx11::string::string<std::allocator<char>>(local_7a0,anon_var_dwarf_15971,&local_1bf3);
  std::__cxx11::string::string<std::allocator<char>>(local_780,anon_var_dwarf_137e3,&local_1bf4);
  std::__cxx11::string::string<std::allocator<char>>(local_760,anon_var_dwarf_1597d,&local_1bf5);
  std::__cxx11::string::string<std::allocator<char>>(local_740,anon_var_dwarf_15989,&local_1bf6);
  std::__cxx11::string::string<std::allocator<char>>(local_720,anon_var_dwarf_15995,&local_1bf7);
  std::__cxx11::string::string<std::allocator<char>>(local_700,anon_var_dwarf_14ed7,&local_1bf8);
  std::__cxx11::string::string<std::allocator<char>>(local_6e0,anon_var_dwarf_159a1,&local_1bf9);
  std::__cxx11::string::string<std::allocator<char>>(local_6c0,anon_var_dwarf_159ad,&local_1bfa);
  std::__cxx11::string::string<std::allocator<char>>(local_6a0,anon_var_dwarf_159b9,&local_1bfb);
  std::__cxx11::string::string<std::allocator<char>>(local_680,anon_var_dwarf_159c5,&local_1bfc);
  std::__cxx11::string::string<std::allocator<char>>(local_660,anon_var_dwarf_159d1,&local_1bfd);
  std::__cxx11::string::string<std::allocator<char>>(local_640,anon_var_dwarf_159dd,&local_1bfe);
  std::__cxx11::string::string<std::allocator<char>>(local_620,anon_var_dwarf_13e03,&local_1bff);
  std::__cxx11::string::string<std::allocator<char>>
            (local_600,anon_var_dwarf_15d81 + 100,&local_1c00);
  std::__cxx11::string::string<std::allocator<char>>(local_5e0,anon_var_dwarf_159f5,&local_1c01);
  std::__cxx11::string::string<std::allocator<char>>(local_5c0,anon_var_dwarf_15a01,&local_1c02);
  std::__cxx11::string::string<std::allocator<char>>(local_5a0,anon_var_dwarf_15a0d,&local_1c03);
  std::__cxx11::string::string<std::allocator<char>>(local_580,anon_var_dwarf_15a19,&local_1c04);
  std::__cxx11::string::string<std::allocator<char>>(local_560,anon_var_dwarf_15a25,&local_1c05);
  std::__cxx11::string::string<std::allocator<char>>(local_540,anon_var_dwarf_15a31,&local_1c06);
  std::__cxx11::string::string<std::allocator<char>>(local_520,anon_var_dwarf_15a3d,&local_1c07);
  std::__cxx11::string::string<std::allocator<char>>(local_500,anon_var_dwarf_15a49,&local_1c08);
  std::__cxx11::string::string<std::allocator<char>>(local_4e0,anon_var_dwarf_15a55,&local_1c09);
  std::__cxx11::string::string<std::allocator<char>>(local_4c0,anon_var_dwarf_15a61,&local_1c0a);
  std::__cxx11::string::string<std::allocator<char>>(local_4a0,anon_var_dwarf_15a6d,&local_1c0b);
  std::__cxx11::string::string<std::allocator<char>>(local_480,anon_var_dwarf_15a79,&local_1c0c);
  std::__cxx11::string::string<std::allocator<char>>(local_460,anon_var_dwarf_15a85,&local_1c0d);
  std::__cxx11::string::string<std::allocator<char>>(local_440,anon_var_dwarf_15a91,&local_1c0e);
  std::__cxx11::string::string<std::allocator<char>>(local_420,anon_var_dwarf_15a9d,&local_1c0f);
  std::__cxx11::string::string<std::allocator<char>>(local_400,anon_var_dwarf_15aa9,&local_1c10);
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,anon_var_dwarf_15ab5,&local_1c11);
  std::__cxx11::string::string<std::allocator<char>>(local_3c0,anon_var_dwarf_15ac1,&local_1c12);
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,anon_var_dwarf_15acd,&local_1c13);
  std::__cxx11::string::string<std::allocator<char>>(local_380,anon_var_dwarf_15ad9,&local_1c14);
  std::__cxx11::string::string<std::allocator<char>>(local_360,anon_var_dwarf_15ae5,&local_1c15);
  std::__cxx11::string::string<std::allocator<char>>(local_340,anon_var_dwarf_15af1,&local_1c16);
  std::__cxx11::string::string<std::allocator<char>>(local_320,anon_var_dwarf_15afd,&local_1c17);
  std::__cxx11::string::string<std::allocator<char>>(local_300,anon_var_dwarf_15b09,&local_1c18);
  std::__cxx11::string::string<std::allocator<char>>(local_2e0,anon_var_dwarf_15b15,&local_1c19);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2c0,anon_var_dwarf_15d8d + 100,&local_1c1a);
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,anon_var_dwarf_15b2d,&local_1c1b);
  std::__cxx11::string::string<std::allocator<char>>(local_280,anon_var_dwarf_15b39,&local_1c1c);
  std::__cxx11::string::string<std::allocator<char>>(local_260," ",&local_1c1d);
  std::__cxx11::string::string<std::allocator<char>>(local_240,anon_var_dwarf_15b45,&local_1c1e);
  std::__cxx11::string::string<std::allocator<char>>(local_220,anon_var_dwarf_15b51,&local_1c1f);
  std::__cxx11::string::string<std::allocator<char>>(local_200,anon_var_dwarf_15b5d,&local_1c20);
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,anon_var_dwarf_15b69,&local_1c21);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c0,anon_var_dwarf_15c09 + 0x1a,&local_1c22);
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,anon_var_dwarf_1531d,&local_1c23);
  std::__cxx11::string::string<std::allocator<char>>(local_180,anon_var_dwarf_15b81,&local_1c24);
  std::__cxx11::string::string<std::allocator<char>>(local_160,anon_var_dwarf_15b8d,&local_1c25);
  std::__cxx11::string::string<std::allocator<char>>(local_140,anon_var_dwarf_15b5d,&local_1c26);
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,anon_var_dwarf_15c09 + 0x1a,&local_1c27);
  std::__cxx11::string::string<std::allocator<char>>(local_100,anon_var_dwarf_15b99,&local_1c28);
  std::__cxx11::string::string<std::allocator<char>>(local_e0,anon_var_dwarf_142ef,&local_1c29);
  std::__cxx11::string::string<std::allocator<char>>(local_c0,anon_var_dwarf_15c2f + 4,&local_1c2a);
  std::__cxx11::string::string<std::allocator<char>>(local_a0,anon_var_dwarf_15ba5,&local_1c2b);
  std::__cxx11::string::string<std::allocator<char>>(local_80,anon_var_dwarf_15bb1,&local_1c2c);
  std::__cxx11::string::string<std::allocator<char>>(local_60,anon_var_dwarf_15bbd,&local_1c2d);
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,anon_var_dwarf_15bc9,(allocator<char> *)&local_1c2e);
  __l_00._M_len = 0xd5;
  __l_00._M_array = (iterator)local_1ac0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vals,__l_00,&local_1b59);
  lVar1 = 0x1a80;
  do {
    std::__cxx11::string::~string((string *)(local_1ac0 + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  lVar1 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)keys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)keys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1ac0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&((keys.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar1),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&((vals.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar1));
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&map,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1ac0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_1ac0);
    lVar1 = lVar1 + 0x20;
  }
  this = (ConfusableMatcher *)operator_new(0x2000);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_1b10,&map);
  local_1af8._M_buckets = &local_1af8._M_single_bucket;
  local_1af8._M_bucket_count = 1;
  local_1af8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1af8._M_element_count = 0;
  local_1af8._M_rehash_policy._M_max_load_factor = 1.0;
  local_1af8._M_rehash_policy._4_4_ = 0;
  local_1af8._M_rehash_policy._M_next_resize = 0;
  local_1af8._M_single_bucket = (__node_base_ptr)0x0;
  ConfusableMatcher::ConfusableMatcher
            (this,&local_1b10,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_1af8,true);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_1af8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_1b10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vals);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&keys);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&map);
  return this;
}

Assistant:

ConfusableMatcher *LidlNormalizerCMSetup()
{
	auto map = GetDefaultMap();

	// Additional test data
	std::vector<std::string> keys = { 
		"A", "A", "A", "A", "B", "U", "U", "O", "O", "A", "A",
		"A", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y",
		"Z", "A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y", "Z", "0",
		"A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y", "Z",
		"A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y", "Z",
		"A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y", "Z",
		"A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y", "Z",
		"A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y", "Z",
		"U", "A", " ", "S", "M", "O", "L", "N", "A", "T", "I", "O", "N", "N", "I", "G", "N", "I", "FREE", "AE"
	};
	std::vector<std::string> vals = {
		"\U00000105", "\U0000ab31", "\U00001d43", "\U000000e5", "\U0000249d", "\U000000fc", "\U000000dc", "\U000000f6", "\U000000d6", "\U000000e4", "\U000000c4", "\U0000249c", "\U0000249e", "\U0000249f", "\U000024a0", "\U000024a1", "\U000024a2", "\U000024a3", "\U000024a4", "\U000024a5", "\U000024a6", "\U000024a7", "\U000024a8", "\U000024a9", "\U000024aa", "\U000024ab", "\U000024ac", "\U000024ad", "\U000024ae", "\U000024af", "\U000024b0", "\U000024b1", "\U000024b2", "\U000024b3", "\U000024b4", "\U000024cf", "\U000024d0", "\U000024d1", "\U000024d2", "\U000024d3", "\U000024d4", "\U000024d5", "\U000024d6", "\U000024d7", "\U000024d8", "\U000024d9", "\U000024da", "\U000024db", "\U000024dc", "\U000024dd", "\U000024de", "\U000024df", "\U000024e0", "\U000024e1", "\U000024e2", "\U000024e3", "\U000024e4", "\U000024e5", "\U000024e6", "\U000024e7", "\U000024e8", "\U000024e9", "\U000024ea", "\U0001d552", "\U0001d553", "\U0001d554", "\U0001d555", "\U0001d556", "\U0001d557", "\U0001d558", "\U0001d559", "\U0001d55a", "\U0001d55b", "\U0001d55c", "\U0001d55d", "\U0001d55e", "\U0001d55f", "\U0001d560", "\U0001d561", "\U0001d562", "\U0001d563", "\U0001d564", "\U0001d565", "\U0001d566", "\U0001d567", "\U0001d568", "\U0001d569", "\U0001d56a", "\U0001d56b", "\U0001f130", "\U0001f131", "\U0001f132", "\U0001f133", "\U0001f134", "\U0001f135", "\U0001f136", "\U0001f137", "\U0001f138", "\U0001f139", "\U0001f13a", "\U0001f13b", "\U0001f13c", "\U0001f13d", "\U0001f13e", "\U0001f13f", "\U0001f140", "\U0001f141", "\U0001f142", "\U0001f143", "\U0001f144", "\U0001f145", "\U0001f146", "\U0001f147", "\U0001f148", "\U0001f149", "\U000020b3", "\U00000e3f", "\U000020b5", "\U00000110", "\U00000246", "\U000020a3", "\U000020b2", "\U00002c67", "\U00000142", "\U0000004a", "\U000020ad", "\U00002c60", "\U000020a5", "\U000020a6", "\U000000d8", "\U000020b1", "\U00000051", "\U00002c64", "\U000020b4", "\U000020ae", "\U00000244", "\U00000056", "\U000020a9", "\U000004fe", "\U0000024e", "\U00002c6b", "\U0001d586", "\U0001d587", "\U0001d588", "\U0001d589", "\U0001d58a", "\U0001d58b", "\U0001d58c", "\U0001d58d", "\U0001d58e", "\U0001d58f", "\U0001d590", "\U0001d591", "\U0001d592", "\U0001d593", "\U0001d594", "\U0001d595", "\U0001d596", "\U0001d597", "\U0001d598", "\U0001d599", "\U0001d59a", "\U0001d59b", "\U0001d59c", "\U0001d59d", "\U0001d59e", "\U0001d59f", "\U0001f170", "\U0001f171", "\U0001f172", "\U0001f173", "\U0001f174", "\U0001f175", "\U0001f176", "\U0001f177", "\U0001f178", "\U0001f179", "\U0001f17a", "\U0001f17b", "\U0001f17c", "\U0001f17d", "\U0001f17e", "\U0001f17f", "\U0001f180", "\U0001f181", "\U0001f182", "\U0001f183", "\U0001f184", "\U0001f185", "\U0001f186", "\U0001f187", "\U0001f188", "\U0001f189", "\U0001f1fa", "\U0001f1e6", " ", "\U000002e2", "\U00001d50", "\U00001d52", "\U000002e1", "\U0000207f", "\U00001d43", "\U00001d57", "\U00001da6", "\U00001d52", "\U0000207f", "\U0000041d", "\U00000438", "\U00000433", "\U0001F1F3", "\U0001F1EE", "\U0001f193", "\U00001d2d"
	};
	
	for (auto x = 0;x < keys.size();x++)
		map.push_back(std::pair(keys[x], vals[x]));

	auto matcher = new ConfusableMatcher(map, { });

	return matcher;
}